

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O0

char * flatcc_json_parser_build_uint8_vector_base64
                 (flatcc_json_parser_t *ctx,char *buf,char *end,flatcc_builder_ref_t *ref,
                 int urlsafe)

{
  int iVar1;
  flatcc_builder_ref_t fVar2;
  char *pcVar3;
  int ret;
  int mode;
  size_t src_len;
  size_t decoded_len;
  size_t max_len;
  uint8_t *pval;
  char *mark;
  flatcc_builder_ref_t *pfStack_30;
  int urlsafe_local;
  flatcc_builder_ref_t *ref_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  mark._4_4_ = urlsafe;
  pfStack_30 = ref;
  ref_local = (flatcc_builder_ref_t *)end;
  end_local = buf;
  buf_local = (char *)ctx;
  pval = (uint8_t *)flatcc_json_parser_string_start(ctx,buf,end);
  end_local = (char *)pval;
  end_local = flatcc_json_parser_string_part
                        ((flatcc_json_parser_t *)buf_local,(char *)pval,(char *)ref_local);
  if (((flatcc_builder_ref_t *)end_local != ref_local) &&
     ((char)*(flatcc_builder_ref_t *)end_local == '\"')) {
    decoded_len = base64_decoded_size((long)end_local - (long)pval);
    iVar1 = flatcc_builder_start_vector(*(flatcc_builder_t **)buf_local,1,1,0xffffffff);
    if ((iVar1 != 0) ||
       (max_len = (size_t)flatcc_builder_extend_vector(*(flatcc_builder_t **)buf_local,decoded_len),
       (uint8_t *)max_len == (uint8_t *)0x0)) {
LAB_00125662:
      *pfStack_30 = 0;
      pcVar3 = flatcc_json_parser_set_error
                         ((flatcc_json_parser_t *)buf_local,end_local,(char *)ref_local,0x23);
      return pcVar3;
    }
    _ret = (long)end_local - (long)pval;
    src_len = decoded_len;
    iVar1 = base64_decode((uint8_t *)max_len,pval,&src_len,(size_t *)&ret,(uint)(urlsafe != 0));
    if (iVar1 == 0) {
      if (_ret == (long)end_local - (long)pval) {
        if ((decoded_len <= src_len) ||
           (iVar1 = flatcc_builder_truncate_vector
                              (*(flatcc_builder_t **)buf_local,decoded_len - src_len), iVar1 == 0))
        {
          fVar2 = flatcc_builder_end_vector(*(flatcc_builder_t **)buf_local);
          *pfStack_30 = fVar2;
          if (fVar2 != 0) {
            pcVar3 = flatcc_json_parser_string_end
                               ((flatcc_json_parser_t *)buf_local,end_local,(char *)ref_local);
            return pcVar3;
          }
        }
        goto LAB_00125662;
      }
      end_local = (char *)(pval + _ret);
    }
    else {
      end_local = (char *)(pval + _ret);
    }
  }
  *pfStack_30 = 0;
  iVar1 = 0x1f;
  if (mark._4_4_ != 0) {
    iVar1 = 0x20;
  }
  pcVar3 = flatcc_json_parser_set_error
                     ((flatcc_json_parser_t *)buf_local,end_local,(char *)ref_local,iVar1);
  return pcVar3;
}

Assistant:

const char *flatcc_json_parser_build_uint8_vector_base64(flatcc_json_parser_t *ctx,
        const char *buf, const char *end, flatcc_builder_ref_t *ref, int urlsafe)
{
    const char *mark;
    uint8_t *pval;
    size_t max_len;
    size_t decoded_len, src_len;
    int mode;
    int ret;

    mode = urlsafe ? base64_mode_url : base64_mode_rfc4648;
    buf = flatcc_json_parser_string_start(ctx, buf, end);
    buf = flatcc_json_parser_string_part(ctx, (mark = buf), end);
    if (buf == end || *buf != '\"') {
        goto base64_failed;
    }
    max_len = base64_decoded_size((size_t)(buf - mark));
    if (flatcc_builder_start_vector(ctx->ctx, 1, 1, FLATBUFFERS_COUNT_MAX((utype_size)))) {
        goto failed;
    }
    if (!(pval = flatcc_builder_extend_vector(ctx->ctx, max_len))) {
        goto failed;
    }
    src_len = (size_t)(buf - mark);
    decoded_len = max_len;
    if ((ret = base64_decode(pval, (const uint8_t *)mark, &decoded_len, &src_len, mode))) {
        buf = mark + src_len;
        goto base64_failed;
    }
    if (src_len != (size_t)(buf - mark)) {
        buf = mark + src_len;
        goto base64_failed;
    }
    if (decoded_len < max_len) {
        if (flatcc_builder_truncate_vector(ctx->ctx, max_len - decoded_len)) {
            goto failed;
        }
    }
    if (!(*ref = flatcc_builder_end_vector(ctx->ctx))) {
        goto failed;
    }
    return flatcc_json_parser_string_end(ctx, buf, end);

failed:
    *ref = 0;
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);

base64_failed:
    *ref = 0;
    return flatcc_json_parser_set_error(ctx, buf, end,
            urlsafe ? flatcc_json_parser_error_base64url : flatcc_json_parser_error_base64);
}